

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O2

bool tinyusdz::hasTripleQuotes(string *str,bool is_double_quote)

{
  pointer pcVar1;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  
  pcVar1 = (str->_M_dataplus)._M_p;
  uVar2 = str->_M_string_length;
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    if (uVar3 + 3 < uVar2) {
      if (is_double_quote) {
        if (((pcVar1[uVar3] == '\"') && (pcVar1[uVar3 + 1] == '\"')) && (pcVar1[uVar3 + 2] == '\"'))
        break;
      }
      else if (((pcVar1[uVar3] == '\'') && (pcVar1[uVar3 + 1] == '\'')) &&
              (pcVar1[uVar3 + 2] == '\'')) break;
    }
  }
  return uVar3 < uVar2;
}

Assistant:

bool hasTripleQuotes(const std::string &str, bool is_double_quote) {
  for (size_t i = 0; i < str.size(); i++) {
    if (i + 3 < str.size()) {
      if (is_double_quote) {
        if ((str[i + 0] == '"') && (str[i + 1] == '"') && (str[i + 2] == '"')) {
          return true;
        }
      } else {
        if ((str[i + 0] == '\'') && (str[i + 1] == '\'') &&
            (str[i + 2] == '\'')) {
          return true;
        }
      }
    }
  }

  return false;
}